

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::ReadColumnSizes<false>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong local_38 [2];
  ArgList local_28;
  
  iVar1 = (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  uVar3 = iVar1 - 1;
  uVar2 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
  if (uVar2 != uVar3) {
    local_38[0] = (ulong)uVar3;
    local_28.types_ = 2;
    local_28.field_1.values_ = (Value *)local_38;
    TextReader<fmt::Locale>::DoReportError
              (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x13a06d,&local_28
              );
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  if (1 < iVar1) {
    do {
      TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadColumnSizes() {
  int num_sizes = header_.num_vars - 1;
  if (reader_.ReadUInt() != num_sizes)
    reader_.ReportError("expected {}", num_sizes);
  reader_.ReadTillEndOfLine();
  typename Handler::ColumnSizeHandler size_handler = handler_.OnColumnSizes();
  int prev_size = 0;
  for (int i = 0; i < num_sizes; ++i) {
    int size = reader_.ReadUInt();
    if (CUMULATIVE) {
      if (size < prev_size)
        reader_.ReportError("invalid column offset");
      size -= prev_size;
      prev_size += size;
    }
    size_handler.Add(size);
    reader_.ReadTillEndOfLine();
  }
}